

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O3

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  double dVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char *pcVar11;
  long lVar12;
  iteratorCol *piVar13;
  char *pcVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  if (firstn == 1) {
    iterdata::usrpt = (UserIter *)usrdata;
    iterdata::hdupt = *(FitsHdu **)((long)usrdata + 0x40);
    iterdata::nnum = *usrdata;
    iterdata::ncmp = *(int *)((long)usrdata + 4);
    iterdata::ntxt = *(int *)((long)usrdata + 0x38);
    iterdata::nfloat = *(int *)((long)usrdata + 8);
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::ncmp + iterdata::nnum),4);
    iterdata::repeat = (long *)calloc((long)narray,8);
    iterdata::datatype = (int *)calloc((long)narray,4);
    if (0 < narray) {
      uVar18 = 0;
      piVar13 = iter_col;
      do {
        lVar6 = fits_iter_get_repeat(piVar13);
        iterdata::repeat[uVar18] = lVar6;
        iVar4 = fits_iter_get_datatype(piVar13);
        iterdata::datatype[uVar18] = iVar4;
        uVar18 = uVar18 + 1;
        piVar13 = piVar13 + 1;
      } while ((uint)narray != uVar18);
    }
    iterdata_find_badspace = 0;
    iterdata_find_badlog = '\0';
  }
  uVar5 = iterdata::ncmp + iterdata::nnum;
  uVar18 = (ulong)uVar5;
  if (uVar5 != 0 && SCARRY4(iterdata::ncmp,iterdata::nnum) == (int)uVar5 < 0) {
    lVar6 = 0;
    if (0 < nrows) {
      lVar6 = nrows;
    }
    lVar15 = 0;
    do {
      pvVar7 = fits_iter_get_array(iter_col + lVar15);
      lVar12 = iterdata::repeat[lVar15];
      if ((nrows << (iterdata::nnum <= lVar15) != 0 && lVar12 != 0) &&
         (iterdata::usrpt->indatatyp[lVar15] == 1)) {
        pdVar16 = (double *)((long)pvVar7 + lVar12 * 8);
        lVar17 = 1;
        lVar19 = -8;
        do {
          if (lVar6 + lVar17 == 1) goto LAB_00108047;
          dVar1 = *pdVar16;
          lVar17 = lVar17 + -1;
          pdVar16 = pdVar16 + lVar12;
          lVar19 = lVar19 + 8;
        } while ((iterdata::usrpt->mask[lVar15] & (byte)(int)dVar1) == 0);
        uVar5 = fits_iter_get_colnum(iter_col + lVar15);
        sprintf(errmes,"Row #%ld, and Column #%d: X vector ",firstn - lVar17,(ulong)uVar5);
        lVar12 = iterdata::repeat[lVar15];
        if (0 < lVar12) {
          lVar17 = 0;
          do {
            sprintf(comm,"0x%02x ",
                    (ulong)((int)*(double *)((long)pvVar7 + lVar17 * 8 + lVar12 * lVar19 + 8) & 0xff
                           ));
            strcat(errmes,comm);
            lVar12 = iterdata::repeat[lVar15];
            lVar17 = lVar17 + 1;
          } while (lVar17 < lVar12);
        }
        sVar8 = strlen(errmes);
        builtin_strncpy(errmes + sVar8 + 0xf,"tified.",8);
        builtin_strncpy(errmes + sVar8,"is not l",8);
        builtin_strncpy(errmes + sVar8 + 8,"eft just",8);
        wrterr(iterdata::usrpt->out,errmes,2);
        builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
        print_fmt(iterdata::usrpt->out,errmes,0xd);
      }
LAB_00108047:
      lVar15 = lVar15 + 1;
      uVar18 = (long)iterdata::nnum + (long)iterdata::ncmp;
    } while (lVar15 < (long)uVar18);
  }
  if (iterdata::ntxt < 1) {
    uVar18 = (ulong)(uint)((int)uVar18 + iterdata::ntxt);
  }
  else {
    lVar6 = (long)(int)uVar18;
    do {
      if (iterdata::datatype[lVar6] == 0x10) {
        if (nrows != 0) {
          pvVar7 = fits_iter_get_array(iter_col + lVar6);
          if (0 < nrows) {
            lVar15 = 0;
            do {
              pcVar9 = *(char **)((long)pvVar7 + lVar15 * 8 + 8);
              cVar2 = *pcVar9;
              while (cVar2 != '\0') {
                pcVar9 = pcVar9 + 1;
                if ((byte)(cVar2 + 0x81U) < 0xa1) {
                  uVar5 = fits_iter_get_colnum(iter_col + lVar6);
                  sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",
                          lVar15 + firstn,(ulong)uVar5);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  break;
                }
                cVar2 = *pcVar9;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != nrows);
          }
        }
      }
      else if (nrows != 0 && iterdata::repeat[lVar6] != 0) {
        pvVar7 = fits_iter_get_array(iter_col + lVar6);
        if (iterdata_find_badlog == '\0') {
          lVar15 = iterdata::repeat[lVar6];
          lVar12 = lVar15 * nrows;
          if (0 < lVar12) {
            lVar17 = 0;
            do {
              if (2 < *(byte *)((long)pvVar7 + lVar17 + 1)) {
                uVar5 = fits_iter_get_colnum(iter_col + lVar6);
                sprintf(errmes,
                        "Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                        (lVar17 + firstn + -1) / lVar15 + 1,(ulong)uVar5);
                wrterr(iterdata::usrpt->out,errmes,1);
                builtin_strncpy(errmes,"             (Other rows may have similar errors).",0x33);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badlog = '\x01';
                break;
              }
              lVar17 = lVar17 + 1;
            } while (lVar12 - lVar17 != 0);
          }
        }
      }
      lVar6 = lVar6 + 1;
      uVar18 = (long)iterdata::ntxt + (long)iterdata::ncmp + (long)iterdata::nnum;
    } while (lVar6 < (long)uVar18);
  }
  if (0 < iterdata::nfloat) {
    lVar6 = (long)(int)uVar18;
    do {
      if (nrows != 0) {
        piVar13 = iter_col + lVar6;
        puVar10 = (undefined8 *)fits_iter_get_array(piVar13);
        iterdata_find_badspace = 0;
        if (0 < nrows) {
          pcVar9 = (char *)*puVar10;
          lVar15 = 0;
          do {
            pcVar14 = (char *)puVar10[lVar15 + 1];
            iVar4 = strcmp(pcVar9,pcVar14);
            if ((iVar4 != 0) && (pcVar11 = strchr(pcVar14,0x2e), pcVar11 == (char *)0x0)) {
              for (; *pcVar14 == ' '; pcVar14 = pcVar14 + 1) {
              }
              if (*pcVar14 != '\0') {
                uVar5 = fits_iter_get_colnum(piVar13);
                sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",
                        lVar15 + firstn,(ulong)uVar5);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcVar14);
                sVar8 = strlen(errmes);
                builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
                builtin_strncpy(errmes + sVar8,"  (Other",8);
                builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
                builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
                builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                bVar3 = iterdata_find_badspace;
                goto LAB_001083f0;
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != nrows);
          bVar3 = 0;
LAB_001083f0:
          if (0 < nrows && (bVar3 & 1) == 0) {
            lVar15 = 0;
            do {
              pcVar9 = (char *)puVar10[lVar15 + 1];
              iVar4 = strcmp((char *)*puVar10,pcVar9);
              if (iVar4 != 0) {
                do {
                  pcVar14 = pcVar9;
                  pcVar9 = pcVar14 + 1;
                } while (*pcVar14 == ' ');
                sVar8 = strlen(pcVar14);
                if (sVar8 != 1 && -1 < (long)(sVar8 - 1)) {
                  do {
                    if (pcVar14[sVar8 - 1] != ' ') break;
                    pcVar14[sVar8 - 1] = '\0';
                    sVar8 = sVar8 - 1;
                  } while (1 < (long)sVar8);
                }
                pcVar9 = strchr(pcVar14,0x20);
                if (pcVar9 != (char *)0x0) {
                  uVar5 = fits_iter_get_colnum(piVar13);
                  sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",
                          lVar15 + firstn,(ulong)uVar5);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  strcpy(errmes,pcVar14);
                  sVar8 = strlen(errmes);
                  builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
                  builtin_strncpy(errmes + sVar8,"  (Other",8);
                  builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
                  builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
                  builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  iterdata_find_badspace = 1;
                  break;
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != nrows);
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)iterdata::nfloat + (long)iterdata::ntxt +
                     (long)iterdata::ncmp + (long)iterdata::nnum);
  }
  if (firstn + nrows + -1 == totaln) {
    free(iterdata::flag_minmax);
    free(iterdata::datatype);
    free(iterdata::repeat);
  }
  return 0;
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
    static FitsHdu  *hdupt;
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    int flag_cmpnull = 0;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
	hdupt= usrpt->hduptr;
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	flag_cmpnull = 0;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}